

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O3

int cram_seek_to_refpos(cram_fd *fd,cram_range *r)

{
  int iVar1;
  cram_index *pcVar2;
  
  pcVar2 = cram_index_query(fd,r->refid,r->start,(cram_index *)0x0);
  if (pcVar2 == (cram_index *)0x0) {
    cram_seek_to_refpos_cold_1();
    iVar1 = -1;
  }
  else {
    iVar1 = cram_seek(fd,pcVar2->offset,0);
    if ((iVar1 != 0) && (iVar1 = cram_seek(fd,pcVar2->offset - fd->first_container,1), iVar1 != 0))
    {
      return -1;
    }
    if (fd->ctr != (cram_container *)0x0) {
      cram_free_container(fd->ctr);
      fd->ctr = (cram_container *)0x0;
      fd->ooc = 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cram_seek_to_refpos(cram_fd *fd, cram_range *r) {
    cram_index *e;

    // Ideally use an index, so see if we have one.
    if ((e = cram_index_query(fd, r->refid, r->start, NULL))) {
	if (0 != cram_seek(fd, e->offset, SEEK_SET))
	    if (0 != cram_seek(fd, e->offset - fd->first_container, SEEK_CUR))
		return -1;
    } else {
	fprintf(stderr, "Unknown reference ID. Missing from index?\n");
	return -1;
    }

    if (fd->ctr) {
	cram_free_container(fd->ctr);
	fd->ctr = NULL;
	fd->ooc = 0;
    }

    return 0;
}